

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

size_t coda_revxspc(char *s,char *n,size_t len)

{
  int iVar1;
  int iVar2;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  char *x;
  char *p;
  char *b;
  char *local_38;
  char *local_30;
  
  local_30 = (char *)(in_RDI + -1 + in_RDX);
  do {
    local_38 = in_RSI;
    if (local_30 <= (char *)(in_RDI + -1)) {
      return (in_RDI + -1 + in_RDX) - (long)local_30;
    }
    for (; *local_38 != '\0'; local_38 = local_38 + 1) {
      iVar1 = tolower((int)*local_30);
      iVar2 = tolower((int)*local_38);
      if (iVar1 == iVar2) {
        return (in_RDI + -1 + in_RDX) - (long)local_30;
      }
    }
    local_30 = local_30 + -1;
  } while( true );
}

Assistant:

size_t coda_revxspc(const char *s, const char *n, size_t len)
{
	const char *b = s - 1;
	const char *p = s - 1 + len;
	const char *x;

	for (; p > b; --p)
	{
		for (x = n; *x; ++x)
		{
			if (tolower(*p) == tolower(*x)) return s - 1 + len - p;
		}
	}

	return s - 1 + len - p;
}